

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall
TPZEqnArray<std::complex<long_double>_>::TPZEqnArray(TPZEqnArray<std::complex<long_double>_> *this)

{
  long lVar1;
  
  TPZVec<int>::TPZVec((TPZVec<int> *)&this->fEqStart,0);
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore =
       (this->fEqStart).super_TPZManVector<int,_100>.fExtAlloc;
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements = 0;
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNAlloc = 0;
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019c9eb8;
  TPZVec<int>::TPZVec((TPZVec<int> *)&this->fEqNumber,0);
  (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore =
       (this->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc;
  (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements = 0;
  (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fNAlloc = 0;
  (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019c9eb8;
  (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
  super_TPZVec<std::complex<long_double>_>.fStore = (complex<long_double> *)0x0;
  (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
  super_TPZVec<std::complex<long_double>_>.fNElements = 0;
  (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
  super_TPZVec<std::complex<long_double>_>.fNAlloc = 0;
  (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
  super_TPZVec<std::complex<long_double>_>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019ca3f8;
  lVar1 = 0x3a0;
  do {
    *(longdouble *)((long)(this->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar1 + -0x38) =
         (longdouble)0;
    *(longdouble *)((long)(this->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar1 + -0x28) =
         (longdouble)0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x80a0);
  (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
  super_TPZVec<std::complex<long_double>_>.fStore =
       (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.fExtAlloc;
  (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
  super_TPZVec<std::complex<long_double>_>.fNElements = 0;
  (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
  super_TPZVec<std::complex<long_double>_>.fNAlloc = 0;
  (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
  super_TPZVec<std::complex<long_double>_>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019ca388;
  TPZVec<int>::TPZVec((TPZVec<int> *)&this->fIndex,0);
  (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore =
       (this->fIndex).super_TPZManVector<int,_1000>.fExtAlloc;
  (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fNElements = 0;
  (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fNAlloc = 0;
  (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019ca018;
  (*(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec[3])
            (&this->fEqStart,
             (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements + 1);
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore
  [(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements + -1] = 0;
  this->fLastTerm = 0;
  this->fSymmetric = EIsUndefined;
  this->fNumEq = 0;
  return;
}

Assistant:

TPZEqnArray<TVar>::TPZEqnArray() : fEqStart(), fEqNumber(), fEqValues(), fIndex() {
	fEqStart.Push(0);
	fNumEq=0;
	fLastTerm=0;
	fSymmetric=EIsUndefined;
	
}